

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

weak_ptr<libtorrent::aux::torrent> __thiscall
libtorrent::aux::session_impl::find_disconnect_candidate_torrent(session_impl *this)

{
  bool bVar1;
  reference __r;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  weak_ptr<libtorrent::aux::torrent> wVar3;
  shared_ptr<libtorrent::aux::torrent> local_48;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
  local_38;
  shared_ptr<libtorrent::aux::torrent> *local_30;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
  local_28;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
  local_20;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
  i;
  session_impl *this_local;
  
  local_28._M_current =
       (shared_ptr<libtorrent::aux::torrent> *)
       torrent_list<libtorrent::aux::torrent>::begin
                 ((torrent_list<libtorrent::aux::torrent> *)(in_RSI + 0x1428));
  local_30 = (shared_ptr<libtorrent::aux::torrent> *)
             torrent_list<libtorrent::aux::torrent>::end
                       ((torrent_list<libtorrent::aux::torrent> *)(in_RSI + 0x1428));
  local_20 = ::std::
             min_element<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::aux::torrent>const*,std::vector<std::shared_ptr<libtorrent::aux::torrent>,std::allocator<std::shared_ptr<libtorrent::aux::torrent>>>>,bool(*)(std::shared_ptr<libtorrent::aux::torrent>const&,std::shared_ptr<libtorrent::aux::torrent>const&)>
                       (local_28,(__normal_iterator<const_std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
                                  )local_30,anon_unknown_119::compare_disconnect_torrent);
  local_38._M_current =
       (shared_ptr<libtorrent::aux::torrent> *)
       torrent_list<libtorrent::aux::torrent>::end
                 ((torrent_list<libtorrent::aux::torrent> *)(in_RSI + 0x1428));
  bVar1 = __gnu_cxx::operator==(&local_20,&local_38);
  if (bVar1) {
    ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr(&local_48);
    ::std::weak_ptr<libtorrent::aux::torrent>::weak_ptr<libtorrent::aux::torrent,void>
              ((weak_ptr<libtorrent::aux::torrent> *)this,&local_48);
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr(&local_48);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    __r = __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<libtorrent::aux::torrent>_*,_std::vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>_>
          ::operator*(&local_20);
    ::std::weak_ptr<libtorrent::aux::torrent>::weak_ptr<libtorrent::aux::torrent,void>
              ((weak_ptr<libtorrent::aux::torrent> *)this,__r);
    _Var2._M_pi = extraout_RDX_00;
  }
  wVar3.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  wVar3.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (weak_ptr<libtorrent::aux::torrent>)
         wVar3.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::weak_ptr<torrent> session_impl::find_disconnect_candidate_torrent() const
	{
		auto const i = std::min_element(m_torrents.begin(), m_torrents.end()
			, &compare_disconnect_torrent);

		TORRENT_ASSERT(i != m_torrents.end());
		if (i == m_torrents.end()) return std::shared_ptr<torrent>();

		return *i;
	}